

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

void dropt_set_strncmp(dropt_context *context,dropt_strncmp_func cmp)

{
  if (context != (dropt_context *)0x0) {
    if (cmp == (dropt_strncmp_func)0x0) {
      cmp = strncmp;
    }
    context->ncmpstr = cmp;
    free(context->sortedByLong);
    context->sortedByLong = (option_proxy *)0x0;
    free(context->sortedByShort);
    context->sortedByShort = (option_proxy *)0x0;
    return;
  }
  dropt_set_strncmp_cold_1();
  dropt_clear_error(context);
  if (context != (dropt_context *)0x0) {
    free(context->sortedByLong);
    context->sortedByLong = (option_proxy *)0x0;
    free(context->sortedByShort);
    context->sortedByShort = (option_proxy *)0x0;
  }
  free(context);
  return;
}

Assistant:

void
dropt_set_strncmp(dropt_context* context, dropt_strncmp_func cmp)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return;
    }

    if (cmp == NULL) { cmp = dropt_strncmp; }
    context->ncmpstr = cmp;

    /* Changing the sort method invalidates our existing lookup tables. */
    free_lookup_tables(context);
}